

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nhdp_domain.c
# Opt level: O3

void nhdp_domain_init_link(nhdp_link *lnk)

{
  int iVar1;
  uint64_t uVar2;
  list_entity *plVar3;
  list_entity *plVar4;
  long lVar5;
  
  lnk->flooding_willingness = '\0';
  lnk->local_is_flooding_mpr = false;
  lnk->neigh_is_flooding_mpr = false;
  lVar5 = 0;
  do {
    *(undefined8 *)((long)&lnk->_domaindata[0].metric.in + lVar5) = 0xffffff00ffffff;
    uVar2 = oonf_clock_getNow();
    *(uint64_t *)((long)&lnk->_domaindata[0].last_metric_change + lVar5) = uVar2;
    lVar5 = lVar5 + 0x10;
    plVar3 = _domain_list.next;
    plVar4 = _domain_list.prev;
  } while (lVar5 != 0x40);
  for (; plVar3->prev != plVar4; plVar3 = plVar3->next) {
    if (*(char *)&plVar3[-0x28].next[2].next == '\x01') {
      iVar1 = *(int *)((long)&plVar3[-0x27].next + 4);
      lnk->_domaindata[iVar1].metric.in = *(uint32_t *)&plVar3[-0x28].next[1].next;
      lnk->_domaindata[iVar1].metric.out = *(uint32_t *)((long)&plVar3[-0x28].next[1].next + 4);
      plVar4 = _domain_list.prev;
    }
  }
  return;
}

Assistant:

void
nhdp_domain_init_link(struct nhdp_link *lnk) {
  struct nhdp_domain *domain;
  struct nhdp_link_domaindata *data;
  int i;

  /* initialize flooding MPR settings */
  lnk->flooding_willingness = RFC7181_WILLINGNESS_NEVER;
  lnk->local_is_flooding_mpr = false;
  lnk->neigh_is_flooding_mpr = false;

  /* initialize metrics */
  for (i = 0; i < NHDP_MAXIMUM_DOMAINS; i++) {
    lnk->_domaindata[i].metric.in = RFC7181_METRIC_INFINITE;
    lnk->_domaindata[i].metric.out = RFC7181_METRIC_INFINITE;
    lnk->_domaindata[i].last_metric_change = oonf_clock_getNow();
  }
  list_for_each_element(&_domain_list, domain, _node) {
    data = nhdp_domain_get_linkdata(domain, lnk);

    if (domain->metric->no_default_handling) {
      data->metric.in = domain->metric->incoming_link_start;
      data->metric.out = domain->metric->outgoing_link_start;
    }
  }
}